

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

bool __thiscall re2::BitState::TrySearch(BitState *this,int id0,char *p0)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  Job *pJVar4;
  const_pointer pcVar5;
  StringPiece *pSVar6;
  char **ppcVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  uint32_t uVar13;
  byte *pbVar14;
  ulong uVar15;
  ostream *this_00;
  long lVar16;
  Inst *this_01;
  byte bVar17;
  Prog *p;
  byte *p_00;
  long lVar18;
  bool local_1c1;
  LogMessage local_1b0;
  
  pbVar14 = (byte *)((this->text_).data_ + (this->text_).size_);
  this->njob_ = 0;
  bVar10 = ShouldVisit(this,id0,p0);
  if (bVar10) {
    Push(this,id0,p0);
  }
  bVar10 = false;
switchD_001ae59a_caseD_7:
  do {
    uVar15 = (ulong)(uint)this->njob_;
    while( true ) {
      if ((int)uVar15 < 1) {
        return bVar10;
      }
      uVar12 = (int)uVar15 - 1;
      uVar15 = (ulong)uVar12;
      this->njob_ = uVar12;
      pJVar4 = (this->job_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
               super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl;
      uVar12 = pJVar4[uVar15].id;
      p_00 = (byte *)pJVar4[uVar15].p;
      if (-1 < (int)uVar12) break;
      (this->cap_).ptr_._M_t.
      super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
      super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
      super__Head_base<0UL,_const_char_**,_false>._M_head_impl
      [((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
       ((long)&(this->prog_->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter> +
       8))->_M_head_impl[-uVar12].field_1.cap_] = (char *)p_00;
    }
    iVar2 = pJVar4[uVar15].rle;
    if (0 < (long)iVar2) {
      p_00 = p_00 + iVar2;
      pJVar4[uVar15].rle = iVar2 + -1;
      this->njob_ = this->njob_ + 1;
    }
    do {
      local_1c1 = p_00 == pbVar14;
      lVar18 = (long)(int)uVar12;
      p = this->prog_;
      this_01 = (p->inst_).ptr_._M_t.
                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t
                .super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + lVar18;
      uVar12 = this_01->out_opcode_;
      switch(uVar12 & 7) {
      case 0:
switchD_001ae59a_caseD_0:
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/bitstate.cc"
                   ,0xa8);
        this_00 = std::operator<<((ostream *)&local_1b0.str_,"Unexpected opcode: ");
        std::ostream::operator<<(this_00,this_01->out_opcode_ & 7);
        LogMessage::~LogMessage(&local_1b0);
        return false;
      case 1:
switchD_001ae59a_caseD_1:
        do {
          bVar11 = Prog::Inst::greedy(this_01,p);
          if (bVar11) goto LAB_001ae5e9;
          uVar12 = this_01->out_opcode_;
          if (this->longest_ != true) goto LAB_001ae657;
          local_1c1 = true;
          lVar18 = (long)(int)(uVar12 >> 4);
          p = this->prog_;
          this_01 = (p->inst_).ptr_._M_t.
                    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                    _M_t.
                    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                    .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + lVar18;
          uVar12 = this_01->out_opcode_;
          p_00 = pbVar14;
          switch(uVar12 & 7) {
          case 0:
            goto switchD_001ae59a_caseD_0;
          case 2:
            goto switchD_001ae59a_caseD_2;
          case 3:
            goto switchD_001ae59a_caseD_3;
          case 4:
            goto switchD_001ae59a_caseD_4;
          case 5:
            goto switchD_001ae59a_caseD_5;
          case 6:
            goto switchD_001ae59a_caseD_6;
          case 7:
            goto switchD_001ae59a_caseD_7;
          }
        } while( true );
      case 2:
        goto switchD_001ae59a_caseD_2;
      case 3:
switchD_001ae59a_caseD_3:
        if ((uVar12 & 8) == 0) {
          Push(this,(int)lVar18 + 1,(char *)p_00);
        }
        iVar2 = (this_01->field_1).cap_;
        if ((-1 < (long)iVar2) &&
           (iVar2 < (int)(this->cap_).ptr_._M_t.
                         super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>.
                         _M_t.
                         super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>
                         .super__Tuple_impl<1UL,_re2::PODArray<const_char_*>::Deleter>.
                         super__Head_base<1UL,_re2::PODArray<const_char_*>::Deleter,_false>)) {
          Push(this,-(int)lVar18,
               (this->cap_).ptr_._M_t.
               super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
               super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
               super__Head_base<0UL,_const_char_**,_false>._M_head_impl[iVar2]);
          (this->cap_).ptr_._M_t.
          super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
          super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
          super__Head_base<0UL,_const_char_**,_false>._M_head_impl[(this_01->field_1).cap_] =
               (char *)p_00;
        }
        break;
      case 4:
        goto switchD_001ae59a_caseD_4;
      case 5:
        goto switchD_001ae59a_caseD_5;
      case 6:
switchD_001ae59a_caseD_6:
        if ((uVar12 & 8) == 0) {
          Push(this,(int)lVar18 + 1,(char *)p_00);
        }
        break;
      case 7:
        goto switchD_001ae59a_caseD_7;
      }
LAB_001ae6bc:
      uVar12 = this_01->out_opcode_ >> 4;
      bVar11 = ShouldVisit(this,uVar12,(char *)p_00);
    } while (bVar11);
  } while( true );
LAB_001ae5e9:
  local_1c1 = true;
  lVar18 = (long)(this_01->field_1).cap_;
  p = this->prog_;
  this_01 = (p->inst_).ptr_._M_t.
            super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
            super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
            super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + lVar18;
  uVar12 = this_01->out_opcode_;
  p_00 = pbVar14;
  switch(uVar12 & 7) {
  case 0:
    goto switchD_001ae59a_caseD_0;
  case 2:
switchD_001ae59a_caseD_2:
    while( true ) {
      uVar12 = 0xffffffff;
      if (p_00 < pbVar14) {
        uVar12 = (uint)*p_00;
      }
      bVar11 = Prog::Inst::Matches(this_01,uVar12);
      if (bVar11) break;
      uVar12 = this_01->out_opcode_;
LAB_001ae657:
      if ((uVar12 & 8) != 0) goto switchD_001ae59a_caseD_7;
      lVar18 = lVar18 + 1;
      p = this->prog_;
      this_01 = (p->inst_).ptr_._M_t.
                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t
                .super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + lVar18;
      uVar12 = this_01->out_opcode_;
      switch(uVar12 & 7) {
      case 0:
        goto switchD_001ae59a_caseD_0;
      case 1:
        goto switchD_001ae59a_caseD_1;
      case 3:
        goto switchD_001ae59a_caseD_3;
      case 4:
switchD_001ae59a_caseD_4:
        uVar3 = (this_01->field_1).out1_;
        uVar13 = Prog::EmptyFlags(&this->context_,(char *)p_00);
        uVar12 = this_01->out_opcode_;
        if ((uVar3 & ~uVar13) == 0) goto switchD_001ae59a_caseD_6;
        goto LAB_001ae657;
      case 5:
switchD_001ae59a_caseD_5:
        if ((this->endmatch_ != true) || (p_00 == pbVar14)) {
          uVar3 = this->nsubmatch_;
          if (uVar3 == 0) {
            return true;
          }
          (this->cap_).ptr_._M_t.
          super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
          super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
          super__Head_base<0UL,_const_char_**,_false>._M_head_impl[1] = (char *)p_00;
          pcVar5 = this->submatch_->data_;
          if (pcVar5 == (const_pointer)0x0) {
LAB_001ae728:
            uVar15 = (ulong)uVar3;
            if ((int)uVar3 < 1) {
              uVar15 = 0;
            }
            for (lVar16 = 0; uVar15 * 0x10 != lVar16; lVar16 = lVar16 + 0x10) {
              pSVar6 = this->submatch_;
              ppcVar7 = (this->cap_).ptr_._M_t.
                        super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>.
                        _M_t.
                        super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
                        super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
              lVar8 = *(long *)((long)ppcVar7 + lVar16);
              lVar9 = *(long *)((long)ppcVar7 + lVar16 + 8);
              *(long *)((long)&pSVar6->data_ + lVar16) = lVar8;
              *(long *)((long)&pSVar6->size_ + lVar16) = lVar9 - lVar8;
            }
            bVar17 = this->longest_ ^ 1U | p_00 == pbVar14;
          }
          else {
            if (this->longest_ != true) {
              return true;
            }
            bVar17 = local_1c1;
            if (pcVar5 + this->submatch_->size_ < p_00) goto LAB_001ae728;
          }
          bVar10 = true;
          if ((bVar17 & 1) != 0) {
            return true;
          }
        }
        goto LAB_001ae657;
      case 6:
        goto switchD_001ae59a_caseD_6;
      case 7:
        goto switchD_001ae59a_caseD_7;
      }
    }
    uVar1 = (this_01->field_1).field_3.hint_foldcase_;
    if (1 < uVar1) {
      Push(this,(uint)(uVar1 >> 1) + (int)lVar18,(char *)p_00);
    }
    p_00 = p_00 + 1;
    goto LAB_001ae6bc;
  case 3:
    goto switchD_001ae59a_caseD_3;
  case 4:
    goto switchD_001ae59a_caseD_4;
  case 5:
    goto switchD_001ae59a_caseD_5;
  case 6:
    goto switchD_001ae59a_caseD_6;
  case 7:
    goto switchD_001ae59a_caseD_7;
  }
  goto switchD_001ae59a_caseD_1;
}

Assistant:

bool BitState::TrySearch(int id0, const char* p0) {
  bool matched = false;
  const char* end = text_.data() + text_.size();
  njob_ = 0;
  // Push() no longer checks ShouldVisit(),
  // so we must perform the check ourselves.
  if (ShouldVisit(id0, p0))
    Push(id0, p0);
  while (njob_ > 0) {
    // Pop job off stack.
    --njob_;
    int id = job_[njob_].id;
    int& rle = job_[njob_].rle;
    const char* p = job_[njob_].p;

    if (id < 0) {
      // Undo the Capture.
      cap_[prog_->inst(-id)->cap()] = p;
      continue;
    }

    if (rle > 0) {
      p += rle;
      // Revivify job on stack.
      --rle;
      ++njob_;
    }

  Loop:
    // Visit id, p.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode: " << ip->opcode();
        return false;

      case kInstFail:
        break;

      case kInstAltMatch:
        if (ip->greedy(prog_)) {
          // out1 is the Match instruction.
          id = ip->out1();
          p = end;
          goto Loop;
        }
        if (longest_) {
          // ip must be non-greedy...
          // out is the Match instruction.
          id = ip->out();
          p = end;
          goto Loop;
        }
        goto Next;

      case kInstByteRange: {
        int c = -1;
        if (p < end)
          c = *p & 0xFF;
        if (!ip->Matches(c))
          goto Next;

        if (ip->hint() != 0)
          Push(id+ip->hint(), p);  // try the next when we're done
        id = ip->out();
        p++;
        goto CheckAndLoop;
      }

      case kInstCapture:
        if (!ip->last())
          Push(id+1, p);  // try the next when we're done

        if (0 <= ip->cap() && ip->cap() < cap_.size()) {
          // Capture p to register, but save old value first.
          Push(-id, cap_[ip->cap()]);  // undo when we're done
          cap_[ip->cap()] = p;
        }

        id = ip->out();
        goto CheckAndLoop;

      case kInstEmptyWidth:
        if (ip->empty() & ~Prog::EmptyFlags(context_, p))
          goto Next;

        if (!ip->last())
          Push(id+1, p);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstNop:
        if (!ip->last())
          Push(id+1, p);  // try the next when we're done
        id = ip->out();

      CheckAndLoop:
        // Sanity check: id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        DCHECK(id == 0 || prog_->inst(id-1)->last());
        if (ShouldVisit(id, p))
          goto Loop;
        break;

      case kInstMatch: {
        if (endmatch_ && p != end)
          goto Next;

        // We found a match.  If the caller doesn't care
        // where the match is, no point going further.
        if (nsubmatch_ == 0)
          return true;

        // Record best match so far.
        // Only need to check end point, because this entire
        // call is only considering one start position.
        matched = true;
        cap_[1] = p;
        if (submatch_[0].data() == NULL ||
            (longest_ && p > submatch_[0].data() + submatch_[0].size())) {
          for (int i = 0; i < nsubmatch_; i++)
            submatch_[i] =
                StringPiece(cap_[2 * i],
                            static_cast<size_t>(cap_[2 * i + 1] - cap_[2 * i]));
        }

        // If going for first match, we're done.
        if (!longest_)
          return true;

        // If we used the entire text, no longer match is possible.
        if (p == end)
          return true;

        // Otherwise, continue on in hope of a longer match.
        // Note the absence of the ShouldVisit() check here
        // due to execution remaining in the same list.
      Next:
        if (!ip->last()) {
          id++;
          goto Loop;
        }
        break;
      }
    }
  }
  return matched;
}